

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

Vector3f __thiscall pbrt::DirectionCone::ClosestVectorInCone(DirectionCone *this,Vector3f wp)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar13;
  float fVar15;
  undefined1 auVar11 [16];
  float fVar14;
  undefined1 auVar12 [64];
  float fVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  Vector3f VVar23;
  
  auVar17 = wp._12_12_;
  fVar16 = wp.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._8_56_ = wp._8_56_;
  auVar12._0_8_ = wp.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._0_4_ = wp.super_Tuple3<pbrt::Vector3,_float>.x * wp.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar9._4_4_ = wp.super_Tuple3<pbrt::Vector3,_float>.y * wp.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar9._8_4_ = wp.super_Tuple3<pbrt::Vector3,_float>.z * wp.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._12_4_ = wp._12_4_ * wp._12_4_;
  auVar9 = vhaddps_avx(auVar9,auVar9);
  fVar6 = fVar16 * fVar16 + auVar9._0_4_;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
    auVar17 = SUB6012((undefined1  [60])0x0,0);
  }
  else {
    auVar9 = vsqrtss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
    fVar6 = auVar9._0_4_;
  }
  auVar18._4_4_ = fVar6;
  auVar18._0_4_ = fVar6;
  auVar18._8_4_ = fVar6;
  auVar18._12_4_ = fVar6;
  auVar9 = vdivps_avx(auVar12._0_16_,auVar18);
  uVar21 = auVar9._0_8_;
  auVar18 = vmovshdup_avx(auVar9);
  auVar5._0_4_ = fVar16 / fVar6;
  auVar5._4_12_ = auVar17;
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ *
                                         (this->w).super_Tuple3<pbrt::Vector3,_float>.y)),auVar9,
                           ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar3 = vfmadd231ss_fma(auVar3,auVar5,
                           ZEXT416((uint)(this->w).super_Tuple3<pbrt::Vector3,_float>.z));
  fVar6 = this->cosTheta;
  if (auVar3._0_4_ <= fVar6) {
    auVar3 = vfnmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),ZEXT416(0x3f800000));
    auVar3 = vmaxss_avx(auVar3,ZEXT816(0) << 0x40);
    if (auVar3._0_4_ < 0.0) {
      fVar6 = sqrtf(auVar3._0_4_);
    }
    else {
      auVar3 = vsqrtss_avx(auVar3,auVar3);
      fVar6 = auVar3._0_4_;
    }
    auVar10._4_12_ = auVar9._4_12_;
    auVar10._0_4_ = auVar5._0_4_;
    auVar22._0_8_ = CONCAT44(auVar9._4_4_,auVar5._0_4_) ^ 0x8000000080000000;
    auVar22._8_4_ = -auVar9._8_4_;
    auVar22._12_4_ = -auVar9._12_4_;
    fVar16 = (this->w).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar1 = this->cosTheta;
    uVar2._0_4_ = (this->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar2._4_4_ = (this->w).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar2;
    auVar4 = vmovshdup_avx(auVar19);
    auVar3 = vinsertps_avx(auVar19,ZEXT416((uint)fVar16),0x10);
    auVar20 = ZEXT416((uint)(auVar9._0_4_ * auVar4._0_4_));
    auVar11 = vfmsub213ss_fma(ZEXT416((uint)fVar16),auVar5,auVar20);
    auVar20 = vfnmadd231ss_fma(auVar20,auVar9,auVar4);
    fVar8 = auVar20._0_4_ + auVar11._0_4_;
    auVar20._0_4_ = auVar5._0_4_ * auVar3._0_4_;
    auVar20._4_4_ = auVar9._4_4_ * auVar3._4_4_;
    auVar20._8_4_ = auVar9._8_4_ * auVar3._8_4_;
    auVar20._12_4_ = auVar9._12_4_ * auVar3._12_4_;
    auVar11 = vshufps_avx(auVar20,auVar20,0xe1);
    auVar11 = vfmsub231ps_fma(auVar11,auVar19,auVar9);
    auVar11 = vshufps_avx(auVar11,auVar11,0xe1);
    auVar3 = vfnmadd213ps_fma(auVar3,auVar10,auVar20);
    fVar7 = auVar11._0_4_ + auVar3._0_4_;
    fVar13 = auVar11._4_4_ + auVar3._4_4_;
    fVar14 = auVar11._8_4_ + auVar3._8_4_;
    fVar15 = auVar11._12_4_ + auVar3._12_4_;
    auVar4 = vmulss_avx512f(auVar4,ZEXT416((uint)fVar1));
    auVar11._0_4_ = fVar7 * fVar7;
    auVar11._4_4_ = fVar13 * fVar13;
    auVar11._8_4_ = fVar14 * fVar14;
    auVar11._12_4_ = fVar15 * fVar15;
    auVar3 = vmovshdup_avx(auVar11);
    fVar8 = auVar11._0_4_ + fVar8 * fVar8 + auVar3._0_4_;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
      auVar4 = ZEXT416(auVar4._0_4_);
    }
    else {
      auVar3 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
      fVar8 = auVar3._0_4_;
    }
    fVar8 = -fVar6 / fVar8;
    fVar6 = (this->w).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar7 = (this->w).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar13 = (this->w).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar7),auVar18,ZEXT416((uint)(auVar5._0_4_ * fVar13)));
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)((fVar7 * fVar7 + fVar13 * fVar13) * -auVar9._0_4_)),
                              ZEXT416((uint)fVar6),auVar3);
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * fVar13)),auVar9,ZEXT416((uint)fVar6));
    auVar3 = vmovshdup_avx(auVar22);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * (fVar6 * fVar6 + fVar13 * fVar13))),
                             ZEXT416((uint)fVar7),auVar5);
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * fVar7)),auVar9,ZEXT416((uint)fVar6));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)((float)auVar22._0_8_ * (fVar6 * fVar6 + fVar7 * fVar7)))
                             ,ZEXT416((uint)fVar13),auVar9);
    auVar5 = vaddss_avx512f(auVar4,ZEXT416((uint)(fVar8 * auVar9._0_4_)));
    auVar9 = vinsertps_avx(ZEXT416((uint)(fVar1 * fVar16 + auVar11._0_4_ * fVar8)),
                           ZEXT416((uint)(fVar1 * (float)(undefined4)uVar2 + fVar8 * auVar3._0_4_)),
                           0x10);
    uVar21 = auVar9._0_8_;
  }
  VVar23.super_Tuple3<pbrt::Vector3,_float>.z = auVar5._0_4_;
  VVar23.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar21;
  VVar23.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar21 >> 0x20);
  return (Vector3f)VVar23.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

DirectionCone::ClosestVectorInCone(Vector3f wp) const {
    DCHECK(!empty);
    wp = Normalize(wp);
    // Return provided vector if it is inside the cone
    if (Dot(wp, w) > cosTheta)
        return wp;

    // Find closest vector by rotating _wp_ until it touches the cone
    Float sinTheta = -SafeSqrt(1 - cosTheta * cosTheta);
    Vector3f a = Cross(wp, w);
    return cosTheta * w +
           (sinTheta / Length(a)) *
               Vector3f(w.x * (wp.y * w.y + wp.z * w.z) - wp.x * (Sqr(w.y) + Sqr(w.z)),
                        w.y * (wp.x * w.x + wp.z * w.z) - wp.y * (Sqr(w.x) + Sqr(w.z)),
                        w.z * (wp.x * w.x + wp.y * w.y) - wp.z * (Sqr(w.x) + Sqr(w.y)));
}